

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

int __thiscall
glslang::HlslParseContext::flatten
          (HlslParseContext *this,TVariable *variable,TType *type,TFlattenData *flattenData,
          TString *name,bool linkage,TQualifier *outerQualifier,TArraySizes *builtInArraySizes)

{
  TString *pTVar1;
  TFlattenData *pTVar2;
  TType *pTVar3;
  uint uVar4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_68;
  byte local_39;
  TString *pTStack_38;
  bool linkage_local;
  TString *name_local;
  TFlattenData *flattenData_local;
  TType *type_local;
  TVariable *variable_local;
  HlslParseContext *this_local;
  
  local_39 = linkage;
  pTStack_38 = name;
  name_local = (TString *)flattenData;
  flattenData_local = (TFlattenData *)type;
  type_local = (TType *)variable;
  variable_local = (TVariable *)this;
  uVar4 = (*type->_vptr_TType[0x1d])();
  pTVar3 = type_local;
  pTVar2 = flattenData_local;
  pTVar1 = name_local;
  if ((uVar4 & 1) == 0) {
    uVar5 = (*(code *)(flattenData_local->members).
                      super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                      .
                      super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                      ._M_impl.super__Tp_alloc_type.allocator[3].alignment)();
    pTVar3 = type_local;
    pTVar2 = flattenData_local;
    pTVar1 = name_local;
    if ((uVar5 & 1) == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                    ,0x4d0,
                    "int glslang::HlslParseContext::flatten(const TVariable &, const TType &, TFlattenData &, TString, bool, const TQualifier &, const TArraySizes *)"
                   );
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    basic_string(&local_90,name);
    this_local._4_4_ =
         flattenStruct(this,(TVariable *)pTVar3,(TType *)pTVar2,(TFlattenData *)pTVar1,&local_90,
                       (bool)(local_39 & 1),outerQualifier,builtInArraySizes);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string(&local_90);
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    basic_string(&local_68,name);
    this_local._4_4_ =
         flattenArray(this,(TVariable *)pTVar3,(TType *)pTVar2,(TFlattenData *)pTVar1,&local_68,
                      (bool)(local_39 & 1),outerQualifier);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string(&local_68);
  }
  return this_local._4_4_;
}

Assistant:

int HlslParseContext::flatten(const TVariable& variable, const TType& type,
                              TFlattenData& flattenData, TString name, bool linkage,
                              const TQualifier& outerQualifier,
                              const TArraySizes* builtInArraySizes)
{
    // If something is an arrayed struct, the array flattener will recursively call flatten()
    // to then flatten the struct, so this is an "if else": we don't do both.
    if (type.isArray())
        return flattenArray(variable, type, flattenData, name, linkage, outerQualifier);
    else if (type.isStruct())
        return flattenStruct(variable, type, flattenData, name, linkage, outerQualifier, builtInArraySizes);
    else {
        assert(0); // should never happen
        return -1;
    }
}